

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

Node * makeAlternate(Node *e)

{
  Node *node;
  Node *e_local;
  
  e_local = e;
  if (e->type != 10) {
    e_local = _newNode(10,0x28);
    if (e == (Node *)0x0) {
      __assert_fail("e",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                    ,0xb4,"Node *makeAlternate(Node *)");
    }
    if ((e->rule).next != (Node *)0x0) {
      __assert_fail("!e->any.next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                    ,0xb5,"Node *makeAlternate(Node *)");
    }
    (e_local->rule).variables = e;
    (e_local->name).rule = e;
  }
  return e_local;
}

Assistant:

Node *makeAlternate(Node *e)
{
  if (Alternate != e->type)
    {
      Node *node= newNode(Alternate);
      assert(e);
      assert(!e->any.next);
      node->alternate.first=
	node->alternate.last= e;
      return node;
    }
  return e;
}